

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

QLayoutItem * __thiscall QDockWidgetLayout::takeAt(QDockWidgetLayout *this,int index)

{
  long lVar1;
  QLayoutItem *pQVar2;
  pointer ppQVar3;
  int iVar4;
  long lVar5;
  
  lVar1 = (this->item_list).d.size;
  if (lVar1 != 0) {
    lVar5 = 0;
    iVar4 = 0;
    do {
      pQVar2 = (this->item_list).d.ptr[lVar5];
      if (pQVar2 != (QLayoutItem *)0x0) {
        if (iVar4 == index) {
          ppQVar3 = QList<QLayoutItem_*>::data(&this->item_list);
          ppQVar3[lVar5] = (QLayoutItem *)0x0;
          (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
          return pQVar2;
        }
        iVar4 = iVar4 + 1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar1 != lVar5);
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *QDockWidgetLayout::takeAt(int index)
{
    int j = 0;
    for (int i = 0; i < item_list.size(); ++i) {
        QLayoutItem *item = item_list.at(i);
        if (item == nullptr)
            continue;
        if (index == j) {
            item_list[i] = 0;
            invalidate();
            return item;
        }
        ++j;
    }
    return nullptr;
}